

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# verify_name_match_unittest.cc
# Opt level: O0

void __thiscall
bssl::VerifyNameMatchRDNSorting_Simple_Test::~VerifyNameMatchRDNSorting_Simple_Test
          (VerifyNameMatchRDNSorting_Simple_Test *this)

{
  VerifyNameMatchRDNSorting_Simple_Test *this_local;
  
  ~VerifyNameMatchRDNSorting_Simple_Test(this);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(VerifyNameMatchRDNSorting, Simple) {
  std::string a;
  ASSERT_TRUE(LoadTestData("ascii", "PRINTABLESTRING", "rdn_sorting_1", &a));
  std::string b;
  ASSERT_TRUE(LoadTestData("ascii", "PRINTABLESTRING", "rdn_sorting_2", &b));
  EXPECT_TRUE(
      VerifyNameMatch(SequenceValueFromString(a), SequenceValueFromString(b)));
  EXPECT_TRUE(
      VerifyNameMatch(SequenceValueFromString(b), SequenceValueFromString(a)));
}